

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

int Gia_ObjSimRsb(Gia_SimRsbMan_t *p,int iObj,int nCands,int fVerbose,int *pnBufs,int *pnInvs)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  word *pwVar5;
  word *pIn2;
  word *pDiv;
  Vec_Int_t *vCands;
  word *pFunc;
  word *pCareSet;
  Vec_Int_t *vTfo;
  int RetValue;
  int iCand;
  int i;
  int *pnInvs_local;
  int *pnBufs_local;
  int fVerbose_local;
  int nCands_local;
  int iObj_local;
  Gia_SimRsbMan_t *p_local;
  
  vTfo._4_4_ = 0;
  pVVar4 = Gia_SimRsbTfo(p,iObj,-1);
  pwVar5 = Gia_SimRsbCareSet(p,iObj,pVVar4);
  pIn2 = Vec_WrdEntryP(p->vSimsObj,p->nWords * iObj);
  pVVar4 = Gia_ObjSimCands(p,iObj,nCands);
  Abc_TtAndSharp(p->pFunc[0],pwVar5,pIn2,p->nWords,1);
  Abc_TtAndSharp(p->pFunc[1],pwVar5,pIn2,p->nWords,0);
  for (RetValue = 0; iVar1 = Vec_IntSize(pVVar4), RetValue < iVar1; RetValue = RetValue + 1) {
    uVar2 = Vec_IntEntry(pVVar4,RetValue);
    pwVar5 = Vec_WrdEntryP(p->vSimsObj,p->nWords * uVar2);
    iVar1 = Abc_TtIntersect(pwVar5,p->pFunc[0],p->nWords,0);
    if ((iVar1 == 0) && (iVar1 = Abc_TtIntersect(pwVar5,p->pFunc[1],p->nWords,1), iVar1 == 0)) {
      *pnBufs = *pnBufs + 1;
      if (fVerbose != 0) {
        uVar3 = Gia_ObjLevelId(p->pGia,iObj);
        printf("Level %3d : %d = buf(%d)\n",(ulong)uVar3,(ulong)(uint)iObj,(ulong)uVar2);
      }
      vTfo._4_4_ = 1;
    }
    iVar1 = Abc_TtIntersect(pwVar5,p->pFunc[0],p->nWords,1);
    if ((iVar1 == 0) && (iVar1 = Abc_TtIntersect(pwVar5,p->pFunc[1],p->nWords,0), iVar1 == 0)) {
      *pnInvs = *pnInvs + 1;
      if (fVerbose != 0) {
        uVar3 = Gia_ObjLevelId(p->pGia,iObj);
        printf("Level %3d : %d = inv(%d)\n",(ulong)uVar3,(ulong)(uint)iObj,(ulong)uVar2);
      }
      vTfo._4_4_ = 1;
    }
  }
  return vTfo._4_4_;
}

Assistant:

int Gia_ObjSimRsb( Gia_SimRsbMan_t * p, int iObj, int nCands, int fVerbose, int * pnBufs, int * pnInvs )
{
    int i, iCand, RetValue = 0;
    Vec_Int_t * vTfo   = Gia_SimRsbTfo( p, iObj, -1 );
    word * pCareSet    = Gia_SimRsbCareSet( p, iObj, vTfo );
    word * pFunc       = Vec_WrdEntryP( p->vSimsObj, p->nWords*iObj );
    Vec_Int_t * vCands = Gia_ObjSimCands( p, iObj, nCands );
    Abc_TtAndSharp( p->pFunc[0], pCareSet, pFunc, p->nWords, 1 );
    Abc_TtAndSharp( p->pFunc[1], pCareSet, pFunc, p->nWords, 0 );

/*
printf( "Considering node %d with %d candidates:\n", iObj, Vec_IntSize(vCands) );
Vec_IntPrint( vTfo );
Vec_IntPrint( vCands );
Extra_PrintBinary( stdout, (unsigned *)pCareSet,    64 );  printf( "\n" );
Extra_PrintBinary( stdout, (unsigned *)pFunc,       64 );  printf( "\n" );
Extra_PrintBinary( stdout, (unsigned *)p->pFunc[0], 64 );  printf( "\n" );
Extra_PrintBinary( stdout, (unsigned *)p->pFunc[1], 64 );  printf( "\n" );
*/
    Vec_IntForEachEntry( vCands, iCand, i )
    {
        word * pDiv = Vec_WrdEntryP( p->vSimsObj, p->nWords*iCand );
        if ( !Abc_TtIntersect(pDiv, p->pFunc[0], p->nWords, 0) &&
             !Abc_TtIntersect(pDiv, p->pFunc[1], p->nWords, 1) )
            { (*pnBufs)++; if ( fVerbose ) printf( "Level %3d : %d = buf(%d)\n", Gia_ObjLevelId(p->pGia, iObj), iObj, iCand ); RetValue = 1; }
        if ( !Abc_TtIntersect(pDiv, p->pFunc[0], p->nWords, 1) &&
             !Abc_TtIntersect(pDiv, p->pFunc[1], p->nWords, 0) )
            { (*pnInvs)++; if ( fVerbose ) printf( "Level %3d : %d = inv(%d)\n", Gia_ObjLevelId(p->pGia, iObj), iObj, iCand ); RetValue = 1; }
    }
    return RetValue;
}